

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::BuildProfiledCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
          (IRBuilder *this,OpCode newOpcode,uint32 offset)

{
  CallFlags CVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  CallFlags CVar4;
  undefined4 *puVar5;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *pOVar6;
  Instr *pIVar7;
  OpCode local_3c;
  OpCode local_3a;
  Instr *instr;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>_>
  *layout;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  bVar3 = OpCodeAttr::IsProfiledOpWithICIndex(newOpcode);
  if (!bVar3) {
    bVar3 = Js::OpCodeUtil::IsProfiledCallOpWithICIndex(newOpcode);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x1898,
                         "(OpCodeAttr::IsProfiledOpWithICIndex(newOpcode) || Js::OpCodeUtil::IsProfiledCallOpWithICIndex(newOpcode))"
                         ,
                         "OpCodeAttr::IsProfiledOpWithICIndex(newOpcode) || Js::OpCodeUtil::IsProfiledCallOpWithICIndex(newOpcode)"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  bVar3 = OpCodeAttr::HasMultiSizeLayout(newOpcode);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x1899,"(OpCodeAttr::HasMultiSizeLayout(newOpcode))",
                       "OpCodeAttr::HasMultiSizeLayout(newOpcode)");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pOVar6 = Js::ByteCodeReader::
           GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>>>
                     (&this->m_jnReader);
  sourceContextId = Func::GetSourceContextId(this->m_func);
  functionId = Func::GetLocalFunctionId(this->m_func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClosureRegCheckPhase,sourceContextId,functionId);
  if (!bVar3) {
    DoClosureRegCheck(this,(pOVar6->
                           super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           ).
                           super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return);
    DoClosureRegCheck(this,(pOVar6->
                           super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           ).
                           super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                           .super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function
                     );
  }
  pIVar7 = BuildProfiledCallIWithICIndex
                     (this,newOpcode,offset,
                      (pOVar6->
                      super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                      ).super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Return,
                      (pOVar6->
                      super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                      ).super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function,
                      (pOVar6->
                      super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                      ).super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.ArgCount,
                      pOVar6->profileId,
                      (pOVar6->
                      super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
                      ).super_OpLayoutT_CallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.
                      inlineCacheIndex);
  if (pIVar7->m_opcode != CallIFlags) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x18a3,"(instr->m_opcode == Js::OpCode::CallIFlags)",
                       "instr->m_opcode == Js::OpCode::CallIFlags");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pIVar7->m_opcode == CallIFlags) {
    CVar1 = (pOVar6->super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>
            ).callFlags;
    CVar4 = Js::operator|(CallFlags_NewTarget,CallFlags_New);
    CVar4 = Js::operator|(CVar4,CallFlags_ExtraArg);
    if (CVar1 == CVar4) {
      local_3a = CallINewTargetNew;
    }
    else {
      if ((pOVar6->super_OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
          callFlags == CallFlags_New) {
        local_3c = CallINew;
      }
      else {
        local_3c = pIVar7->m_opcode;
      }
      local_3a = local_3c;
    }
    pIVar7->m_opcode = local_3a;
  }
  return;
}

Assistant:

void
IRBuilder::BuildProfiledCallIFlagsWithICIndex(Js::OpCode newOpcode, uint32 offset)
{
    Assert(OpCodeAttr::IsProfiledOpWithICIndex(newOpcode) || Js::OpCodeUtil::IsProfiledCallOpWithICIndex(newOpcode));
    Assert(OpCodeAttr::HasMultiSizeLayout(newOpcode));
    auto layout = m_jnReader.GetLayout<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlagsWithICIndex<SizePolicy>>>();

    if (!PHASE_OFF(Js::ClosureRegCheckPhase, m_func))
    {
        this->DoClosureRegCheck(layout->Return);
        this->DoClosureRegCheck(layout->Function);
    }

    IR::Instr* instr = BuildProfiledCallIWithICIndex(newOpcode, offset, layout->Return, layout->Function, layout->ArgCount, layout->profileId, layout->inlineCacheIndex);
    Assert(instr->m_opcode == Js::OpCode::CallIFlags);
    if (instr->m_opcode == Js::OpCode::CallIFlags)
    {
        instr->m_opcode =
            layout->callFlags == (Js::CallFlags::CallFlags_NewTarget | Js::CallFlags::CallFlags_New | Js::CallFlags::CallFlags_ExtraArg) ? Js::OpCode::CallINewTargetNew :
            layout->callFlags == Js::CallFlags::CallFlags_New ? Js::OpCode::CallINew :
            instr->m_opcode;
    }
}